

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_aggregate.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundAggregateExpression *aggr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  pointer this_00;
  pointer pEVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stat;
  vector<duckdb::BaseStatistics,_true> stats;
  AggregateStatisticsInput input;
  undefined1 local_d0 [8];
  undefined1 local_c8 [32];
  __node_base local_a8;
  LogicalType local_a0;
  Expression *local_88;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  
  local_c8._0_8_ = (ClientContext *)0x0;
  local_c8._8_8_ = (LogicalOperator *)0x0;
  local_c8._16_8_ = (pointer)0x0;
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::reserve
            ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)local_c8,
             (long)expr_ptr[0x32].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
             (long)expr_ptr[0x31].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3);
  _Var1._M_head_impl =
       expr_ptr[0x32].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_a8._M_nxt = (_Hash_node_base *)expr_ptr;
  for (_Var4._M_head_impl =
            expr_ptr[0x31].
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      _Var4._M_head_impl != _Var1._M_head_impl;
      _Var4._M_head_impl = (Expression *)&((_Var4._M_head_impl)->super_BaseExpression).type) {
    PropagateExpression((StatisticsPropagator *)local_d0,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)aggr);
    if (local_d0 == (undefined1  [8])0x0) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)_Var4._M_head_impl);
      LogicalType::LogicalType(&local_a0,&pEVar3->return_type);
      BaseStatistics::CreateUnknown((BaseStatistics *)&local_88,&local_a0);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
      emplace_back<duckdb::BaseStatistics>
                ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)local_c8
                 ,(BaseStatistics *)&local_88);
      BaseStatistics::~BaseStatistics((BaseStatistics *)&local_88);
      LogicalType::~LogicalType(&local_a0);
    }
    else {
      this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                              *)local_d0);
      BaseStatistics::Copy((BaseStatistics *)&local_88,this_00);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
      emplace_back<duckdb::BaseStatistics>
                ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)local_c8
                 ,(BaseStatistics *)&local_88);
      BaseStatistics::~BaseStatistics((BaseStatistics *)&local_88);
    }
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
                local_d0);
  }
  _Var4._M_head_impl =
       (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
        &local_a8._M_nxt[0x2b]._M_nxt)->_M_t).
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (Expression *)0x0) {
    this->optimizer = (Optimizer *)0x0;
  }
  else {
    local_88 = (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                &local_a8._M_nxt[0x34]._M_nxt)->_M_t).
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    local_78._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (aggr->super_Expression).verification_stats.
         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    local_80._M_head_impl = (NodeStatistics *)local_c8;
    uVar2._0_1_ = (aggr->super_Expression).super_BaseExpression.type;
    uVar2._1_1_ = (aggr->super_Expression).super_BaseExpression.expression_class;
    uVar2._2_6_ = *(undefined6 *)&(aggr->super_Expression).super_BaseExpression.field_0xa;
    (*(code *)_Var4._M_head_impl)(this,uVar2);
  }
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector
            ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)local_c8);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundAggregateExpression &aggr,
                                                                     unique_ptr<Expression> &expr_ptr) {
	vector<BaseStatistics> stats;
	stats.reserve(aggr.children.size());
	for (auto &child : aggr.children) {
		auto stat = PropagateExpression(child);
		if (!stat) {
			stats.push_back(BaseStatistics::CreateUnknown(child->return_type));
		} else {
			stats.push_back(stat->Copy());
		}
	}
	if (!aggr.function.statistics) {
		return nullptr;
	}
	AggregateStatisticsInput input(aggr.bind_info.get(), stats, node_stats.get());
	return aggr.function.statistics(context, aggr, input);
}